

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O1

bool __thiscall BasicContainer::intersect(BasicContainer *this,Ray *ray,Hit *result)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  vec2f vVar5;
  BasicPrimitive *pBVar6;
  Triangle *this_00;
  float fVar7;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float fVar8;
  float fVar9;
  HitTmp HVar10;
  mat3x2f jacobi;
  undefined8 local_48;
  float local_40;
  mat3x2f local_38;
  
  HVar10 = treehit(this,ray,this->root);
  fVar7 = HVar10.t;
  pBVar6 = HVar10.primitive;
  if (pBVar6 != (BasicPrimitive *)0x0) {
    uVar1 = (ray->origin).x;
    uVar3 = (ray->origin).y;
    uVar2 = (ray->dir).x;
    uVar4 = (ray->dir).y;
    fVar8 = (ray->dir).z * fVar7 + (ray->origin).z;
    local_48 = CONCAT44(fVar7 * (float)uVar4 + (float)uVar3,fVar7 * (float)uVar2 + (float)uVar1);
    local_40 = fVar8;
    (*(pBVar6->super_Primitive)._vptr_Primitive[4])(pBVar6,&local_48);
    fVar9 = fVar8;
    (*(pBVar6->super_Primitive)._vptr_Primitive[5])(pBVar6,&local_48);
    (*(pBVar6->super_Primitive)._vptr_Primitive[6])(pBVar6,&local_48);
    local_38.data[0][0]._3_1_ = (undefined1)local_48;
    local_38.data[0][1] = (float)((ulong)local_48 >> 8);
    fVar7 = local_38.data[0][1];
    local_38.data[1][0]._0_3_ = (undefined3)((ulong)local_48 >> 0x28);
    local_38.data[1][0]._3_1_ = SUB41(local_40,0);
    local_38.data[1][1]._0_3_ = (undefined3)((uint)local_40 >> 8);
    result->hit = true;
    *(ulong *)&result->field_0x1 = CONCAT44(local_38.data[0][1],local_38.data[0][0]);
    local_38.data[0][1]._3_1_ = (undefined1)((ulong)local_48 >> 0x20);
    (result->p).y = (float)(int)CONCAT41(local_38.data[1][0],local_38.data[0][1]._3_1_);
    (result->p).z =
         (float)(int)(CONCAT35(local_38.data[1][1]._0_3_,
                               CONCAT41(local_38.data[1][0],local_38.data[0][1]._3_1_)) >> 0x20);
    (result->Ns).x = (float)extraout_XMM0_Da;
    (result->Ns).y = (float)extraout_XMM0_Db;
    (result->Ns).z = fVar8;
    (result->Ng).x = (float)extraout_XMM0_Da_00;
    (result->Ng).y = (float)extraout_XMM0_Db_00;
    (result->Ng).z = fVar9;
    vVar5.y = extraout_XMM0_Db_01;
    vVar5.x = extraout_XMM0_Da_01;
    result->uv = vVar5;
    (result->dpdu).x = 0.0;
    (result->dpdu).y = 0.0;
    *(undefined8 *)&(result->dpdu).z = 0;
    (result->dpdv).y = 0.0;
    (result->dpdv).z = 0.0;
    local_38.data[0][1] = fVar7;
    this_00 = (Triangle *)__dynamic_cast(pBVar6,&BasicPrimitive::typeinfo,&Triangle::typeinfo,0);
    Triangle::jacobi(&local_38,this_00);
    (result->dpdu).x = local_38.data[0][0];
    (result->dpdu).y = local_38.data[1][0];
    (result->dpdu).z = local_38.data[2][0];
    (result->dpdv).x = local_38.data[0][1];
    (result->dpdv).y = local_38.data[1][1];
    (result->dpdv).z = local_38.data[2][1];
  }
  return pBVar6 != (BasicPrimitive *)0x0;
}

Assistant:

bool intersect(const Ray& ray, Hit* result) const override
	{
		HitTmp tmp = treehit(ray, root);
		if (!tmp) return false;
		point p = ray.atParam(tmp.t);
		*result = Hit(p, tmp.primitive->Ns(p), tmp.primitive->Ng(p), tmp.primitive->uv(p));
		auto jacobi = dynamic_cast<Triangle const*>(tmp.primitive)->jacobi();
		// TODO implement for other types of primitive
		result->dpdu = jacobi.column(0);
		result->dpdv = jacobi.column(1);
		return true;
	}